

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

EC_T_CHAR * ESCTypeText(EC_T_BYTE byESCType)

{
  char *local_18;
  EC_T_CHAR *pszRet;
  EC_T_BYTE byESCType_local;
  
  if (byESCType == '\x01') {
    local_18 = "Beckhoff ELs (Old)";
  }
  else if (byESCType == '\x02') {
    local_18 = "Beckhoff FPGA ESC 10/20";
  }
  else if (byESCType == '\x04') {
    local_18 = "IPCORE";
  }
  else if (byESCType == '\x11') {
    local_18 = "Beckhoff ET1100";
  }
  else if (byESCType == '\x12') {
    local_18 = "Beckhoff ET1200";
  }
  else if (byESCType == 0x80) {
    local_18 = "Hilscher NetX 100/500";
  }
  else if (byESCType == 0x81) {
    local_18 = "Hilscher NetX 50";
  }
  else if (byESCType == 0x82) {
    local_18 = "Hilscher NetX 5";
  }
  else if (byESCType == 0x83) {
    local_18 = "Hilscher NetX 51/52";
  }
  else if (byESCType == 0x90) {
    local_18 = "Texas Instruments";
  }
  else if (byESCType == 0x98) {
    local_18 = "Infineon";
  }
  else if (byESCType == 0xa0) {
    local_18 = "Renesas";
  }
  else if (byESCType == 0xa8) {
    local_18 = "Innovasic";
  }
  else if (byESCType == 0xb0) {
    local_18 = "HMS";
  }
  else if (byESCType == 0xc0) {
    local_18 = "Microchip";
  }
  else if (byESCType == 0xd0) {
    local_18 = "Trinamic";
  }
  else {
    local_18 = "Unknown Slave Controller";
  }
  return local_18;
}

Assistant:

EC_T_CHAR* ESCTypeText(
    EC_T_BYTE   byESCType   /**< [in]   ESC Type value from Slave Register Offset 0x00 */
                                     )
{
    EC_T_CHAR*      pszRet = EC_NULL;

    switch( byESCType )
    {
    case ESCTYPE_BKHF_ELOLD:            pszRet  = (EC_T_CHAR*)"Beckhoff ELs (Old)"; break;
    case ESCTYPE_ESC10|ESCTYPE_ESC20:   pszRet  = (EC_T_CHAR*)"Beckhoff FPGA ESC 10/20"; break;
    case ESCTYPE_IPCORE:                pszRet  = (EC_T_CHAR*)"IPCORE"; break;
    case ESCTYPE_ET1100:                pszRet  = (EC_T_CHAR*)"Beckhoff ET1100"; break;
    case ESCTYPE_ET1200:                pszRet  = (EC_T_CHAR*)"Beckhoff ET1200"; break;
    case ESCTYPE_NETX100_500:           pszRet  = (EC_T_CHAR*)"Hilscher NetX 100/500"; break;
    case ESCTYPE_NETX50:                pszRet  = (EC_T_CHAR*)"Hilscher NetX 50"; break;
    case ESCTYPE_NETX5:                 pszRet  = (EC_T_CHAR*)"Hilscher NetX 5"; break;
    case ESCTYPE_NETX51_52:             pszRet  = (EC_T_CHAR*)"Hilscher NetX 51/52"; break;
    case ESCTYPE_TI:                    pszRet  = (EC_T_CHAR*)"Texas Instruments"; break;
    case ESCTYPE_INFINEON:              pszRet  = (EC_T_CHAR*)"Infineon"; break;
    case ESCTYPE_RENESAS:               pszRet  = (EC_T_CHAR*)"Renesas"; break;
    case ESCTYPE_INNOVASIC:             pszRet  = (EC_T_CHAR*)"Innovasic"; break;
    case ESCTYPE_HMS:                   pszRet  = (EC_T_CHAR*)"HMS"; break;
    case ESCTYPE_MICROCHIP:             pszRet  = (EC_T_CHAR*)"Microchip"; break;
    case ESCTYPE_TRINAMIC:              pszRet  = (EC_T_CHAR*)"Trinamic"; break;
    default:                            pszRet  = (EC_T_CHAR*)"Unknown Slave Controller"; break;
    }

    return pszRet;
}